

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void cppcms::util::escape(char *begin,char *end,ostream *output)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  streambuf *in_RDX;
  char *in_RSI;
  char *in_RDI;
  streambuf *buf;
  
  lVar2 = std::ios::rdbuf();
  uVar3 = std::ios::operator!(in_RDX + *(long *)(*(long *)in_RDX + -0x18));
  if ((((uVar3 & 1) == 0) && (lVar2 != 0)) && (iVar1 = escape(in_RDI,in_RSI,in_RDX), iVar1 != 0)) {
    std::ios::setstate((int)in_RDX + (int)*(undefined8 *)(*(long *)in_RDX + -0x18));
  }
  return;
}

Assistant:

void escape(char const *begin,char const *end,std::ostream &output)
{
	std::streambuf *buf = output.rdbuf();
	if(!output || !buf)
		return;
	if(escape(begin,end,*buf)!=0)
		output.setstate(std::ios_base::failbit);
}